

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void read_instructions(wasm_reader *wr,vec *instructions)

{
  void *extraout_RDX;
  instruction local_28;
  
  init_vec(instructions,0x10);
  do {
    local_28.op_code = (byte)(*(wr->wr_op).read_instruction)(wr);
    local_28.arg = extraout_RDX;
    (*instructions->append)(instructions,&local_28);
    if ((instruction)local_28.op_code == (instruction)0xb) {
      return;
    }
  } while ((instruction)local_28.op_code != (instruction)0x5);
  return;
}

Assistant:

void read_instructions(wasm_reader *wr, vec *instructions) {
    init_vec(instructions, sizeof(instruction));
    instruction inst;
    do {
        inst = wr->wr_op.read_instruction(wr);
        instructions->append(instructions, &inst);
    } while (inst.op_code != End_ && inst.op_code != Else_);
}